

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_sse.c
# Opt level: O2

void itrans_dst7_pb8_sse(s16 *coeff,s16 *block,int shift,int line,int limit_line,int max_tr_val,
                        int min_tr_val,s8 *iT)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  s8 *psVar6;
  ushort *puVar7;
  undefined1 auVar8 [16];
  int iVar10;
  int iVar11;
  undefined1 auVar9 [16];
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM8 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  
  iVar4 = 1 << ((char)shift - 1U & 0x1f);
  iVar2 = 0;
  iVar3 = 0;
  if (0 < line) {
    iVar3 = line;
  }
  auVar8 = ZEXT416((uint)shift);
  for (; iVar2 != iVar3; iVar2 = iVar2 + 1) {
    psVar6 = iT;
    for (iVar1 = 0; iVar1 != 2; iVar1 = iVar1 + 1) {
      auVar9 = (undefined1  [16])0x0;
      lVar5 = 0;
      puVar7 = (ushort *)coeff;
      while( true ) {
        iVar10 = auVar9._4_4_;
        iVar12 = auVar9._12_4_;
        iVar11 = auVar9._8_4_;
        if ((int)lVar5 == 0x40) break;
        auVar13 = pshuflw(ZEXT216(*puVar7),ZEXT216(*puVar7),0);
        auVar14._0_4_ = auVar13._0_4_;
        auVar14._4_4_ = auVar14._0_4_;
        auVar14._8_4_ = auVar14._0_4_;
        auVar14._12_4_ = auVar14._0_4_;
        auVar13 = pshuflw(ZEXT216(puVar7[line]),ZEXT216(puVar7[line]),0);
        auVar15._0_4_ = auVar13._0_4_;
        auVar15._4_4_ = auVar15._0_4_;
        auVar15._8_4_ = auVar15._0_4_;
        auVar15._12_4_ = auVar15._0_4_;
        auVar13 = pshuflw(ZEXT216(puVar7[line * 2]),ZEXT216(puVar7[line * 2]),0);
        auVar16._0_4_ = auVar13._0_4_;
        auVar16._4_4_ = auVar16._0_4_;
        auVar16._8_4_ = auVar16._0_4_;
        auVar16._12_4_ = auVar16._0_4_;
        auVar13 = pshuflw(ZEXT216(puVar7[line * 3]),ZEXT216(puVar7[line * 3]),0);
        auVar18 = pmovsxbw(in_XMM7,*(undefined8 *)(psVar6 + lVar5));
        in_XMM8 = pmovsxbw(in_XMM8,*(undefined8 *)(psVar6 + lVar5 + 8));
        in_XMM9 = pmovsxbw(in_XMM9,*(undefined8 *)(psVar6 + lVar5 + 0x10));
        in_XMM10 = pmovsxbw(in_XMM10,*(undefined8 *)(psVar6 + lVar5 + 0x18));
        auVar17._0_4_ = auVar13._0_4_;
        auVar17._4_4_ = auVar17._0_4_;
        auVar17._8_4_ = auVar17._0_4_;
        auVar17._12_4_ = auVar17._0_4_;
        auVar13 = pmovzxwd(auVar18,auVar18);
        auVar18 = pmaddwd(auVar13,auVar14);
        auVar13 = pmovzxwd(auVar14,in_XMM8);
        auVar13 = pmaddwd(auVar13,auVar15);
        auVar14 = pmovzxwd(auVar15,in_XMM9);
        auVar15 = pmaddwd(auVar14,auVar16);
        auVar14 = pmovzxwd(auVar13,in_XMM10);
        auVar14 = pmaddwd(auVar14,auVar17);
        auVar9._0_4_ = auVar18._0_4_ + auVar9._0_4_ + auVar15._0_4_ + auVar13._0_4_ + auVar14._0_4_;
        auVar9._4_4_ = auVar18._4_4_ + iVar10 + auVar15._4_4_ + auVar13._4_4_ + auVar14._4_4_;
        auVar9._8_4_ = auVar18._8_4_ + iVar11 + auVar15._8_4_ + auVar13._8_4_ + auVar14._8_4_;
        auVar9._12_4_ = auVar18._12_4_ + iVar12 + auVar15._12_4_ + auVar13._12_4_ + auVar14._12_4_;
        lVar5 = lVar5 + 0x20;
        puVar7 = puVar7 + line * 4;
        in_XMM7 = auVar9;
      }
      auVar13._0_4_ = auVar9._0_4_ + iVar4 >> auVar8;
      auVar13._4_4_ = iVar10 + iVar4 >> auVar8;
      auVar13._8_4_ = iVar11 + iVar4 >> auVar8;
      auVar13._12_4_ = iVar12 + iVar4 >> auVar8;
      auVar9 = packssdw(auVar13,auVar13);
      *(long *)block = auVar9._0_8_;
      coeff = (s16 *)((ushort *)coeff + ((long)(line * 4) * 2 - (long)(line * 8)));
      psVar6 = psVar6 + 4;
      block = block + 4;
    }
    coeff = (s16 *)((ushort *)coeff + 1);
  }
  return;
}

Assistant:

void itrans_dst7_pb8_sse(s16 *coeff, s16 *block, int shift, int line, int limit_line, int max_tr_val, int min_tr_val, s8 *iT)
{
    int i, j, k;
    __m128i s0, s1, s2, s3;
    __m128i c0, c1, c2, c3;
    __m128i e0, e1, e2;
    __m128i r0, r1;
    __m128i zero = _mm_setzero_si128();
    __m128i rnd_factor = _mm_set1_epi32(1 << (shift - 1));
    for (i = 0; i < line; i++)
    {
        s8 *pb8 = iT;
        for (j = 0; j < 2; j++)
        {
            __m128i v0 = zero;
            for (k = 0; k < 2; k++)
            {
                //load src
                s0 = _mm_set1_epi16(coeff[0]);
                s1 = _mm_set1_epi16(coeff[line]);
                s2 = _mm_set1_epi16(coeff[2 * line]);
                s3 = _mm_set1_epi16(coeff[3 * line]);

                c0 = _mm_loadl_epi64((__m128i*)pb8);
                c0 = _mm_cvtepi8_epi16(c0);
                c1 = _mm_loadl_epi64((__m128i*)(pb8 + 8));
                c1 = _mm_cvtepi8_epi16(c1);
                c2 = _mm_loadl_epi64((__m128i*)(pb8 + 16));
                c2 = _mm_cvtepi8_epi16(c2);
                c3 = _mm_loadl_epi64((__m128i*)(pb8 + 24));
                c3 = _mm_cvtepi8_epi16(c3);
                c0 = _mm_unpacklo_epi16(c0, zero);
                c1 = _mm_unpacklo_epi16(c1, zero);
                c2 = _mm_unpacklo_epi16(c2, zero);
                c3 = _mm_unpacklo_epi16(c3, zero);

                e0 = _mm_add_epi32(_mm_madd_epi16(s0, c0), _mm_madd_epi16(s1, c1));
                e1 = _mm_add_epi32(_mm_madd_epi16(s2, c2), _mm_madd_epi16(s3, c3));
                e2 = _mm_add_epi32(e0, e1);

                v0 = _mm_add_epi32(v0, e2);

                pb8 += 32;
                coeff += (4 * line);
            }
            r0 = _mm_add_epi32(v0, rnd_factor);
            r1 = _mm_packs_epi32(_mm_srai_epi32(r0, shift), zero);
            _mm_storel_epi64((__m128i*)block, r1);
            coeff -= (8 * line);
            pb8 -= 60;
            block += 4;
        }
        coeff++;
    }
}